

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O0

void __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::prepareTextureData
          (GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest *this,GLubyte *data)

{
  uint local_4c;
  uint pixel_offset;
  uint x;
  GLfloat depth;
  uint y;
  GLfloat step;
  uint line_size;
  uint n_components_per_pixel;
  GLuint ignored_bytes_per_pixel;
  GLenum ignored_texture_type;
  GLenum ignored_texture_format;
  GLenum ignored_texture_internal_format;
  GLuint texture_size;
  GLfloat *texture_data;
  GLubyte *data_local;
  GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest *this_local;
  
  _ignored_texture_internal_format = data;
  texture_data = (GLfloat *)data;
  data_local = (GLubyte *)this;
  (**(code **)((long)(this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                     super_GPUShader5TextureGatherOffsetDepthTestBase.
                     super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                     super_TestNode._vptr_TestNode + 0x40))
            (this,&ignored_texture_format,&ignored_texture_type,&ignored_bytes_per_pixel,
             &n_components_per_pixel,&line_size);
  for (x = 0; x < ignored_texture_format; x = x + 1) {
    for (local_4c = 0; local_4c < ignored_texture_format; local_4c = local_4c + 1) {
      *(float *)(_ignored_texture_internal_format +
                (ulong)(x * ignored_texture_format + local_4c) * 4) =
           (float)x * (1.0 / (float)ignored_texture_format);
    }
  }
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetDepth2DRepeatYCaseTest::prepareTextureData(glw::GLubyte* data)
{
	/* Data pointer */
	glw::GLfloat* texture_data = (glw::GLfloat*)data;

	/* Get texture info from GPUShader5TextureGatherOffsetDepthTestBase */
	glw::GLuint texture_size;
	glw::GLenum ignored_texture_internal_format;
	glw::GLenum ignored_texture_format;
	glw::GLenum ignored_texture_type;
	glw::GLuint ignored_bytes_per_pixel;

	getTextureInfo(texture_size, ignored_texture_internal_format, ignored_texture_format, ignored_texture_type,
				   ignored_bytes_per_pixel);

	/* Constants */
	const unsigned int n_components_per_pixel = 1;
	const unsigned int line_size			  = n_components_per_pixel * texture_size;
	const glw::GLfloat step					  = 1.0f / ((float)texture_size);

	/* Prepare texture's data */
	for (unsigned int y = 0; y < texture_size; ++y)
	{
		const glw::GLfloat depth = ((float)y) * step;

		for (unsigned int x = 0; x < texture_size; ++x)
		{
			const unsigned int pixel_offset = y * line_size + x * n_components_per_pixel;

			/* texel.depth = depth */
			texture_data[pixel_offset] = depth;
		}
	}
}